

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall kratos::InterfaceVisitor::visit(InterfaceVisitor *this,Generator *generator)

{
  _Rb_tree_header *p_Var1;
  InterfaceRef *ref;
  int iVar2;
  _Base_ptr p_Var3;
  long lVar4;
  long lVar5;
  shared_ptr<kratos::InterfaceInstantiationStmt> sVar6;
  undefined1 local_90 [8];
  set<const_kratos::InterfaceRef_*,_std::less<const_kratos::InterfaceRef_*>,_std::allocator<const_kratos::InterfaceRef_*>_>
  refs;
  shared_ptr<kratos::InterfacePort> interface_p;
  shared_ptr<kratos::IDefinition> def;
  shared_ptr<kratos::Port> p;
  
  lVar4 = (long)(generator->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(generator->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 4;
    lVar5 = 0;
    do {
      Generator::get_stmt((Generator *)local_90,(uint32_t)generator);
      if (*(int *)((long)local_90 + 0x78) == 6) {
        sVar6 = Stmt::as<kratos::InterfaceInstantiationStmt>
                          ((Stmt *)&def.
                                    super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
        (*(this->super_IRVisitor)._vptr_IRVisitor[0x1f])
                  (this,def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,
                   sVar6.
                   super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi._M_pi);
        if (p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          CONCAT44(refs._M_t._M_impl._4_4_,refs._M_t._M_impl._0_4_) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(refs._M_t._M_impl._4_4_,refs._M_t._M_impl._0_4_));
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  refs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&refs;
  refs._M_t._M_impl._0_4_ = 0;
  refs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  refs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  refs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_Var3 = (generator->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(generator->ports_)._M_t._M_impl.super__Rb_tree_header;
  refs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       refs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      Generator::get_port((Generator *)
                          &def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(string *)generator);
      iVar2 = (*(def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)->_vptr__Sp_counted_base[0x1d])();
      if ((char)iVar2 != '\0') {
        Var::as<kratos::InterfacePort>
                  ((Var *)&refs._M_t._M_impl.super__Rb_tree_header._M_node_count);
        ref = *(InterfaceRef **)(refs._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x280);
        interface_p.super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (ref->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (ref->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->_M_use_count + 1;
          }
        }
        update_interface_definition
                  (this,(shared_ptr<kratos::IDefinition> *)
                        &interface_p.
                         super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,ref,generator);
        if (def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
        }
        if (interface_p.super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     interface_p.
                     super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      if (p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::
  _Rb_tree<const_kratos::InterfaceRef_*,_const_kratos::InterfaceRef_*,_std::_Identity<const_kratos::InterfaceRef_*>,_std::less<const_kratos::InterfaceRef_*>,_std::allocator<const_kratos::InterfaceRef_*>_>
  ::~_Rb_tree((_Rb_tree<const_kratos::InterfaceRef_*,_const_kratos::InterfaceRef_*,_std::_Identity<const_kratos::InterfaceRef_*>,_std::less<const_kratos::InterfaceRef_*>,_std::allocator<const_kratos::InterfaceRef_*>_>
               *)local_90);
  return;
}

Assistant:

void visit(Generator* generator) override {
        // local variables
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::InterfaceInstantiation) {
                visit(stmt->as<InterfaceInstantiationStmt>().get());
            }
        }
        // ports as well
        std::set<const InterfaceRef*> refs;
        for (auto const& port_name : generator->get_port_names()) {
            auto p = generator->get_port(port_name);
            if (p->is_interface()) {
                auto interface_p = p->as<InterfacePort>();
                const auto* ref = interface_p->interface();
                auto def = ref->definition();
                update_interface_definition(def, ref, generator);
            }
        }
    }